

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O1

void __thiscall CLIntercept::removeMapPointer(CLIntercept *this,void *ptr)

{
  mutex *__mutex;
  int iVar1;
  undefined8 uVar2;
  pair<std::_Rb_tree_iterator<std::pair<const_void_*const,_CLIntercept::SMapPointerInfo>_>,_std::_Rb_tree_iterator<std::pair<const_void_*const,_CLIntercept::SMapPointerInfo>_>_>
  pVar3;
  void *local_18;
  
  if (ptr != (void *)0x0) {
    __mutex = &this->m_Mutex;
    local_18 = ptr;
    iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar1 != 0) {
      uVar2 = std::__throw_system_error(iVar1);
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      _Unwind_Resume(uVar2);
    }
    pVar3 = std::
            _Rb_tree<const_void_*,_std::pair<const_void_*const,_CLIntercept::SMapPointerInfo>,_std::_Select1st<std::pair<const_void_*const,_CLIntercept::SMapPointerInfo>_>,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_CLIntercept::SMapPointerInfo>_>_>
            ::equal_range(&(this->m_MapPointerInfoMap)._M_t,&local_18);
    std::
    _Rb_tree<const_void_*,_std::pair<const_void_*const,_CLIntercept::SMapPointerInfo>,_std::_Select1st<std::pair<const_void_*const,_CLIntercept::SMapPointerInfo>_>,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_CLIntercept::SMapPointerInfo>_>_>
    ::_M_erase_aux(&(this->m_MapPointerInfoMap)._M_t,(_Base_ptr)pVar3.first._M_node,
                   (_Base_ptr)pVar3.second._M_node);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  return;
}

Assistant:

void CLIntercept::removeMapPointer(
    const void* ptr )
{
    if( ptr )
    {
        std::lock_guard<std::mutex> lock(m_Mutex);
        m_MapPointerInfoMap.erase(ptr);
    }
}